

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::ContainerMetadataCollection::AddRunContainer
          (ContainerMetadataCollection *this,idx_t amount,bool is_inverted)

{
  uchar local_19;
  
  AddContainerType(this,true,is_inverted);
  local_19 = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(amount);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&(this->number_of_runs).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             &local_19);
  this->count_in_segment = this->count_in_segment + 1;
  this->runs_in_segment = this->runs_in_segment + 1;
  return;
}

Assistant:

void ContainerMetadataCollection::AddRunContainer(idx_t amount, bool is_inverted) {
	AddContainerType(true, is_inverted);
	D_ASSERT(amount < MAX_RUN_IDX);
	number_of_runs.push_back(NumericCast<uint8_t>(amount));
	runs_in_segment++;
	count_in_segment++;
}